

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

IdWithExprCoverageBinInitializerSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IdWithExprCoverageBinInitializerSyntax,slang::parsing::Token&,slang::syntax::WithClauseSyntax&>
          (BumpAllocator *this,Token *args,WithClauseSyntax *args_1)

{
  Token id;
  IdWithExprCoverageBinInitializerSyntax *this_00;
  
  this_00 = (IdWithExprCoverageBinInitializerSyntax *)allocate(this,0x28,8);
  id.kind = args->kind;
  id._2_1_ = args->field_0x2;
  id.numFlags.raw = (args->numFlags).raw;
  id.rawLen = args->rawLen;
  id.info = args->info;
  slang::syntax::IdWithExprCoverageBinInitializerSyntax::IdWithExprCoverageBinInitializerSyntax
            (this_00,id,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }